

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundex.cpp
# Opt level: O3

string * Soundex::encode(string *__return_storage_ptr__,string *word)

{
  string encoded;
  string local_30;
  
  encodeString(&local_30,word);
  resize(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Soundex::encode(const string &word) {
    string encoded = encodeString(word);
    return resize(encoded);
}